

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadgamma.hpp
# Opt level: O0

int upload_gamma(int n)

{
  float *data_00;
  size_type sVar1;
  reference pvVar2;
  int local_48;
  int i;
  float *data;
  int height;
  int width;
  vector<TensorEntry,_std::allocator<TensorEntry>_> v;
  int n_local;
  
  v.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = n;
  readGamma((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height,n);
  data_00 = (float *)operator_new__(0x1000000);
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::size
                      ((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height);
    if (sVar1 <= (ulong)(long)local_48) break;
    pvVar2 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::operator[]
                       ((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height,(long)local_48)
    ;
    data_00[local_48 << 2] = (float)(int)pvVar2->a;
    pvVar2 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::operator[]
                       ((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height,(long)local_48)
    ;
    data_00[(long)(local_48 << 2) + 1] = (float)(int)pvVar2->b;
    pvVar2 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::operator[]
                       ((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height,(long)local_48)
    ;
    data_00[local_48 * 4 + 2] = (float)(int)pvVar2->c;
    pvVar2 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::operator[]
                       ((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height,(long)local_48)
    ;
    data_00[local_48 * 4 + 3] = pvVar2->val;
    local_48 = local_48 + 1;
  }
  (*glad_glActiveTexture)(33999);
  create_2D_float_texture(0x400,0x400,4,data_00,0x2600,false);
  if (data_00 != (float *)0x0) {
    operator_delete__(data_00);
  }
  sVar1 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::size
                    ((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height);
  std::vector<TensorEntry,_std::allocator<TensorEntry>_>::~vector
            ((vector<TensorEntry,_std::allocator<TensorEntry>_> *)&height);
  return (int)sVar1;
}

Assistant:

int upload_gamma(int n)
{
	auto v = readGamma(n);
	const int width = 1024;
	const int height = 1024;
	float* data = new float[width * height * 4];
	for (int i=0; i<v.size(); ++i)
	{
		data[i*4+0] = float(v[i].a);
		data[i*4+1] = float(v[i].b);
		data[i*4+2] = float(v[i].c);
		data[i*4+3] = v[i].val;
	}
	glActiveTexture(GL_TEXTURE15);
	create_2D_float_texture(1024, 1024, 4, data, GL_NEAREST);
	delete[] data;
	return v.size();
}